

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmi_helper.c
# Opt level: O0

uint64_t helper_pshufh_mips64(uint64_t fs,uint64_t ft)

{
  uint local_34;
  uint64_t uStack_30;
  uint i;
  LMIValue vs;
  LMIValue vd;
  uint64_t uStack_18;
  uint host;
  uint64_t ft_local;
  uint64_t fs_local;
  
  ft_local = fs;
  uStack_18 = ft;
  vd.uw[1] = 0;
  uStack_30 = fs;
  vs.d = 0;
  for (local_34 = 0; local_34 < 4; local_34 = local_34 + 1) {
    *(undefined2 *)((long)&vs + (ulong)(local_34 ^ vd.uw[1]) * 2) =
         *(undefined2 *)((long)&stack0xffffffffffffffd0 + (uStack_18 & 3 ^ (ulong)vd.uw[1]) * 2);
    uStack_18 = uStack_18 >> 2;
  }
  return vs.d;
}

Assistant:

uint64_t helper_pshufh(uint64_t fs, uint64_t ft)
{
    unsigned host = BYTE_ORDER_XOR(3);
    LMIValue vd, vs;
    unsigned i;

    vs.d = fs;
    vd.d = 0;
    for (i = 0; i < 4; i++, ft >>= 2) {
        vd.uh[i ^ host] = vs.uh[(ft & 3) ^ host];
    }
    return vd.d;
}